

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::base_option::base_option(base_option *this,string *name,size_t type_hash)

{
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  allocator local_2d [20];
  allocator local_19;
  undefined8 local_18;
  
  *in_RDI = &PTR__base_option_00487d98;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5] = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 6),"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 10),"",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  *(undefined1 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

base_option(std::string name, size_t type_hash) : m_name(name), m_type_hash(type_hash) {}